

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O0

clock_t experiment::randomExperiment(uint cashSize)

{
  undefined1 auVar1 [16];
  pointer puVar2;
  result_type_conflict rVar3;
  uint uVar4;
  ulong uVar5;
  clock_t cVar6;
  reference pvVar7;
  clock_t cVar8;
  uint local_2788;
  uint local_2784;
  uint j;
  uint i_2;
  int newA;
  uint i_1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  value_type local_44;
  undefined1 local_40 [4];
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  int *a;
  clock_t finish;
  clock_t start;
  uint cashSize_local;
  
  auVar1 = ZEXT416(cashSize << 8) * ZEXT816(4);
  uVar5 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(uVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  for (local_44 = 0; local_44 < cashSize << 8; local_44 = local_44 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&local_44);
  }
  local_60._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  local_68._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::random_device::random_device((random_device *)&newA);
  rVar3 = std::random_device::operator()((random_device *)&newA);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13f0,(ulong)rVar3);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_60,local_68,&local_13f0);
  std::random_device::~random_device((random_device *)&newA);
  for (i_2 = 0; i_2 < cashSize << 8; i_2 = i_2 + 1) {
    uVar4 = rand();
    index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[i_2] = uVar4;
  }
  j = 0;
  cVar6 = clock();
  for (local_2784 = 0; local_2784 < 1000; local_2784 = local_2784 + 1) {
    for (local_2788 = 0;
        puVar2 = index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, local_2788 < cashSize << 8;
        local_2788 = local_2788 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)local_2788);
      j = puVar2[*pvVar7];
    }
  }
  cVar8 = clock();
  *index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = j;
  if (index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete__(index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return cVar8 - cVar6;
}

Assistant:

clock_t experiment::randomExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    std::vector<unsigned int> index;
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        index.push_back(i);
    }
    std::shuffle(index.begin(), index.end(), std::mt19937(std::random_device()()));
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA = 0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
        for(unsigned int j = 0; j < cashSize * 256; ++j)
        {
            newA = a[index[j]];
        }
    }
    finish = clock();
    a[0]=newA;
    delete []a;
    return finish - start;
}